

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
               (date_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long **ppuVar1;
  undefined1 *puVar2;
  VectorType VVar3;
  date_t dVar4;
  unsigned_long *puVar5;
  _Head_base<0UL,_unsigned_long_*,_false> _Var6;
  data_ptr_t pdVar7;
  int64_t *piVar8;
  long *plVar9;
  ulong *puVar10;
  timestamp_t *ptVar11;
  byte bVar12;
  SelectionVector *pSVar13;
  data_ptr_t pdVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  undefined1 auVar17 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  bool bVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  ulong uVar21;
  VectorBuffer *pVVar22;
  idx_t iVar23;
  ulong extraout_RDX;
  idx_t count_00;
  idx_t idx_in_entry_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var24;
  ulong uVar25;
  Vector *this;
  ulong uVar26;
  Vector *vector;
  undefined1 adds_nulls_00;
  ValidityMask *pVVar27;
  ValidityMask *pVVar28;
  char cVar29;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Var30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var31;
  idx_t idx_in_entry;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var32;
  ValidityMask *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var33;
  unsigned_long uVar34;
  UnifiedVectorFormat UStack_168;
  idx_t iStack_118;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Stack_110;
  ulong uStack_108;
  ValidityMask *pVStack_100;
  unsigned_long uStack_f0;
  code *pcStack_e8;
  _Head_base<0UL,_unsigned_long_*,_false> _Stack_e0;
  _Head_base<0UL,_unsigned_long_*,_false> _Stack_d8;
  unsigned_long *puStack_d0;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *psStack_c8;
  Vector *pVStack_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  undefined1 local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  _func_int ***local_38;
  
  p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88;
  puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  pVVar27 = result_mask;
  local_68 = (element_type *)mask;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ldata;
  if (puVar5 == (unsigned_long *)0x0) {
    if (count != 0) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (Vector *)result_data;
      do {
        dVar4.days = *(int32_t *)
                      ((long)&(local_60._M_pi)->_vptr__Sp_counted_base + (long)_Var24._M_pi * 4);
        uVar26 = (ulong)(uint)dVar4.days;
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a3c1;
        bVar19 = Value::IsFinite<duckdb::date_t>(dVar4);
        if (bVar19) goto LAB_00f7a68e;
        if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_78 = (element_type *)
                     (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          this = (Vector *)&local_78;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a3e5;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_88,(unsigned_long *)this);
          _Var31._M_pi = _Stack_80._M_pi;
          auVar17 = local_88;
          local_88 = (undefined1  [8])0x0;
          _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var32 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)auVar17;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = _Var31._M_pi;
          if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a402;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var32);
          }
          if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a411;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
          }
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a419;
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               this_00);
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar12 = (byte)_Var24._M_pi & 0x3f;
        mask = (ValidityMask *)
               (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        ppuVar1 = &((TemplatedValidityMask<unsigned_long> *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mask)->_vptr__Sp_counted_base)
                   ->validity_mask + ((ulong)_Var24._M_pi >> 6);
        *ppuVar1 = (unsigned_long *)
                   ((ulong)*ppuVar1 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12));
        result_data[(long)_Var24._M_pi] = 0;
        _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(_Var24._M_pi)->_vptr__Sp_counted_base + 1);
      } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count != _Var24._M_pi);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a35d;
      local_78 = (element_type *)count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)local_88,(unsigned_long **)mask,(unsigned_long *)&local_78);
      _Var24._M_pi = _Stack_80._M_pi;
      auVar17 = local_88;
      local_88 = (undefined1  [8])0x0;
      _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var33 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)auVar17;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var24._M_pi;
      this = (Vector *)mask;
      if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a37c;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
        this = (Vector *)mask;
      }
      if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a38f;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
      }
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a397;
      pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data)
      ;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar20->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar5;
      this = (Vector *)&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a467;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)this);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(count + 0x3f >> 6);
      local_50 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      mask = (ValidityMask *)0x0;
      _Var31._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_data;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_data;
      local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count;
      do {
        _Var18._M_pi = local_60._M_pi;
        puVar5 = ((TemplatedValidityMask<unsigned_long> *)&local_68->_vptr_ExtraTypeInfo)->
                 validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
        }
        else {
          _Var24._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar5[(long)mask];
        }
        p_Var33 = this_00 + 4;
        if (count <= this_00 + 4) {
          p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count;
        }
        p_Var32 = p_Var33;
        local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mask;
        if (_Var24._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          p_Var32 = this_00;
          if (_Var24._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
            if (this_00 < p_Var33) {
              do {
                dVar4.days = *(int32_t *)
                              ((long)&(_Var18._M_pi)->_vptr__Sp_counted_base + (long)this_00 * 4);
                uVar26 = (ulong)(uint)dVar4.days;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a4f5;
                bVar19 = Value::IsFinite<duckdb::date_t>(dVar4);
                _Var24._M_pi = _Var18._M_pi;
                result_data = (long *)_Var31._M_pi;
                if (bVar19) goto LAB_00f7a68e;
                if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                    (unsigned_long *)0x0) {
                  local_78 = (element_type *)
                             (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                  this = (Vector *)&local_78;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a519;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_88,(unsigned_long *)this);
                  _Var24._M_pi = _Stack_80._M_pi;
                  auVar17 = local_88;
                  local_88 = (undefined1  [8])0x0;
                  _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var32 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                            internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar17;
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = _Var24._M_pi;
                  if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a536;
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var32);
                  }
                  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a545;
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi)
                    ;
                  }
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a54f;
                  pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(local_50);
                  (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       (unsigned_long *)
                       (pTVar20->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar12 = (byte)this_00 & 0x3f;
                mask = (ValidityMask *)
                       (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                ppuVar1 = &((TemplatedValidityMask<unsigned_long> *)
                           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mask)->
                            _vptr__Sp_counted_base)->validity_mask + ((ulong)this_00 >> 6);
                *ppuVar1 = (unsigned_long *)
                           ((ulong)*ppuVar1 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12)
                           );
                (&(_Var31._M_pi)->_vptr__Sp_counted_base)[(long)this_00] = (_func_int **)0x0;
                this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)&(((original *)&this_00->_vptr__Sp_counted_base)->
                                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 1);
                p_Var32 = this_00;
              } while (p_Var33 != this_00);
            }
          }
          else {
            result_data = (long *)((long)this_00 - (long)p_Var33);
            _Var31._M_pi = local_70._M_pi;
            if (this_00 < p_Var33) {
              local_38 = &(local_70._M_pi)->_vptr__Sp_counted_base + (long)this_00;
              p_Var33 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(local_60._M_pi)->_vptr__Sp_counted_base + (long)this_00 * 4);
              count = 0;
              do {
                if (((ulong)_Var24._M_pi >> (count & 0x3f) & 1) != 0) {
                  dVar4.days = *(int32_t *)
                                ((long)&(((original *)&p_Var33->_vptr__Sp_counted_base)->
                                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + count * 4);
                  uVar26 = (ulong)(uint)dVar4.days;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a5ca;
                  bVar19 = Value::IsFinite<duckdb::date_t>(dVar4);
                  if (bVar19) goto LAB_00f7a68e;
                  if ((result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                      (unsigned_long *)0x0) {
                    local_78 = (element_type *)
                               (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    this = (Vector *)&local_78;
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a5ee;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)local_88,(unsigned_long *)this);
                    _Var31._M_pi = _Stack_80._M_pi;
                    auVar17 = local_88;
                    local_88 = (undefined1  [8])0x0;
                    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var32 = (result_mask->super_TemplatedValidityMask<unsigned_long>).
                              validity_data.internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)auVar17;
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal
                    .
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = _Var31._M_pi;
                    if (p_Var32 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a60b;
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var32);
                    }
                    if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a61a;
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (_Stack_80._M_pi);
                    }
                    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a624;
                    pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                              operator->(local_50);
                    (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         (unsigned_long *)
                         (pTVar20->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
                  }
                  puVar2 = (undefined1 *)
                           ((long)&(((original *)&this_00->_vptr__Sp_counted_base)->
                                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr +
                           (long)&(((original *)
                                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count)->
                                    _vptr__Sp_counted_base)->
                                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr);
                  bVar12 = (byte)puVar2 & 0x3f;
                  mask = (ValidityMask *)((ulong)puVar2 >> 6);
                  puVar10 = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
                            + (long)mask;
                  *puVar10 = *puVar10 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
                  local_38[count] = (_func_int **)0x0;
                }
                count = (long)&(((original *)
                                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count)->
                                 _vptr__Sp_counted_base)->
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + 1;
              } while ((undefined1 *)
                       ((long)&(((original *)
                                &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count)->
                                 _vptr__Sp_counted_base)->
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr +
                       (long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_data)->
                              _vptr__Sp_counted_base) != (undefined1 *)0x0);
              _Var31._M_pi = local_70._M_pi;
              p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(((original *)
                                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count)->
                                  _vptr__Sp_counted_base)->
                                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr +
                        (long)&(((original *)&this_00->_vptr__Sp_counted_base)->
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr);
              count = (idx_t)local_48;
            }
          }
        }
        mask = (ValidityMask *)
               ((long)&((TemplatedValidityMask<unsigned_long> *)
                       &(local_40._M_pi)->_vptr__Sp_counted_base)->validity_mask + 1);
        this_00 = p_Var32;
      } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mask != local_58);
    }
  }
  return;
LAB_00f7a68e:
  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf7a693;
  DatePart::TimezoneMinuteOperator::Operation<duckdb::date_t,long>((date_t)(int32_t)uVar26);
  pVStack_c0 = this;
  _Stack_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_mask;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_data;
  p_Stack_a8 = this_00;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)count;
  _Stack_98._M_pi = p_Var33;
  p_Stack_90 = _Var24._M_pi;
  if (((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2> *)
      &(pVVar27->super_TemplatedValidityMask<unsigned_long>).validity_mask)->_M_ptr ==
      (element_type *)0x0) {
    if (extraout_RDX != 0) {
      uVar34 = (unsigned_long)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mask)->_vptr__Sp_counted_base;
      this_01 = (ValidityMask *)((long)dataptr + 8);
      uVar25 = 0;
      p_Var30 = (_Head_base<0UL,_unsigned_long_*,_false> *)dataptr;
      do {
        uVar21 = uVar25;
        if (uVar34 != 0) {
          uVar21 = (ulong)*(uint *)(uVar34 + uVar25 * 4);
        }
        dVar4.days = *(int32_t *)(uVar26 + uVar21 * 4);
        vector = (Vector *)(ulong)(uint)dVar4.days;
        pcStack_e8 = (code *)0xf7a835;
        bVar19 = Value::IsFinite<duckdb::date_t>(dVar4);
        adds_nulls_00 = SUB81(pVVar27,0);
        cVar29 = (char)p_Var30;
        if (bVar19) goto LAB_00f7a8d5;
        if (((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl ==
            (unsigned_long *)0x0) {
          puStack_d0 = ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x18))->
                       _M_head_impl;
          this = (Vector *)&puStack_d0;
          pcStack_e8 = (code *)0xf7a859;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&_Stack_e0,(unsigned_long *)this);
          _Var16._M_head_impl = _Stack_d8._M_head_impl;
          _Var15._M_head_impl = _Stack_e0._M_head_impl;
          _Stack_e0._M_head_impl = (unsigned_long *)0x0;
          _Stack_d8._M_head_impl = (unsigned_long *)0x0;
          _Var6._M_head_impl =
               ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 8))->_M_head_impl =
               _Var15._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl =
               _Var16._M_head_impl;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_e8 = (code *)0xf7a876;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_head_impl);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d8._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_e8 = (code *)0xf7a885;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d8._M_head_impl);
          }
          pcStack_e8 = (code *)0xf7a88d;
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               this_01);
          ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar12 = (byte)uVar25 & 0x3f;
        mask = (ValidityMask *)((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl;
        *(unsigned_long *)((long)mask + (uVar25 >> 6) * 8) =
             *(unsigned_long *)((long)mask + (uVar25 >> 6) * 8) &
             (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
        (&((TemplatedValidityMask<unsigned_long> *)&pVStack_c0->vector_type)->validity_mask)[uVar25]
             = (unsigned_long *)0x0;
        uVar25 = uVar25 + 1;
      } while (extraout_RDX != uVar25);
    }
  }
  else if (extraout_RDX != 0) {
    uVar34 = (unsigned_long)
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mask)->_vptr__Sp_counted_base;
    psStack_c8 = (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                 ((long)dataptr + 8);
    uVar25 = 0;
    pVVar28 = pVVar27;
    p_Var30 = (_Head_base<0UL,_unsigned_long_*,_false> *)dataptr;
    do {
      uVar21 = uVar25;
      if (uVar34 != 0) {
        uVar21 = (ulong)*(uint *)(uVar34 + uVar25 * 4);
      }
      mask = *(ValidityMask **)
              &((__shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 *)&(pVVar27->super_TemplatedValidityMask<unsigned_long>).validity_mask)->_M_ptr
               [uVar21 >> 6].owned_data.
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>;
      if (((ulong)mask >> (uVar21 & 0x3f) & 1) == 0) {
        if (((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl ==
            (unsigned_long *)0x0) {
          puStack_d0 = ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x18))->
                       _M_head_impl;
          this = (Vector *)&puStack_d0;
          pcStack_e8 = (code *)0xf7a7a7;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&_Stack_e0,(unsigned_long *)this);
          _Var16._M_head_impl = _Stack_d8._M_head_impl;
          _Var15._M_head_impl = _Stack_e0._M_head_impl;
          _Stack_e0._M_head_impl = (unsigned_long *)0x0;
          _Stack_d8._M_head_impl = (unsigned_long *)0x0;
          _Var6._M_head_impl =
               ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 8))->_M_head_impl =
               _Var15._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl =
               _Var16._M_head_impl;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_e8 = (code *)0xf7a7c4;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_head_impl);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d8._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_e8 = (code *)0xf7a7d3;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d8._M_head_impl);
          }
          pcStack_e8 = (code *)0xf7a7dd;
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (psStack_c8);
          ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar12 = (byte)uVar25 & 0x3f;
        ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl[uVar25 >> 6] =
             ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl[uVar25 >> 6] &
             (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
      }
      else {
        dVar4.days = *(int32_t *)(uVar26 + uVar21 * 4);
        vector = (Vector *)(ulong)(uint)dVar4.days;
        pcStack_e8 = (code *)0xf7a702;
        bVar19 = Value::IsFinite<duckdb::date_t>(dVar4);
        adds_nulls_00 = SUB81(pVVar28,0);
        cVar29 = (char)p_Var30;
        this_01 = pVVar27;
        if (bVar19) goto LAB_00f7a8d5;
        if (((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl ==
            (unsigned_long *)0x0) {
          puStack_d0 = ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x18))->
                       _M_head_impl;
          this = (Vector *)&puStack_d0;
          pcStack_e8 = (code *)0xf7a726;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&_Stack_e0,(unsigned_long *)this);
          _Var16._M_head_impl = _Stack_d8._M_head_impl;
          _Var15._M_head_impl = _Stack_e0._M_head_impl;
          _Stack_e0._M_head_impl = (unsigned_long *)0x0;
          _Stack_d8._M_head_impl = (unsigned_long *)0x0;
          _Var6._M_head_impl =
               ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 8))->_M_head_impl =
               _Var15._M_head_impl;
          ((_Head_base<0UL,_unsigned_long_*,_false> *)((long)dataptr + 0x10))->_M_head_impl =
               _Var16._M_head_impl;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_e8 = (code *)0xf7a743;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_head_impl);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d8._M_head_impl !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcStack_e8 = (code *)0xf7a752;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_d8._M_head_impl);
          }
          pcStack_e8 = (code *)0xf7a75c;
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (psStack_c8);
          ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        bVar12 = (byte)uVar25 & 0x3f;
        ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl[uVar25 >> 6] =
             ((_Head_base<0UL,_unsigned_long_*,_false> *)dataptr)->_M_head_impl[uVar25 >> 6] &
             (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
        (&((TemplatedValidityMask<unsigned_long> *)&pVStack_c0->vector_type)->validity_mask)[uVar25]
             = (unsigned_long *)0x0;
      }
      uVar25 = uVar25 + 1;
    } while (extraout_RDX != uVar25);
  }
  return;
LAB_00f7a8d5:
  pcStack_e8 = 
  ExecuteStandard<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
  ;
  DatePart::TimezoneMinuteOperator::Operation<duckdb::date_t,long>((date_t)(int32_t)vector);
  VVar3 = vector->vector_type;
  p_Stack_110 = (_Head_base<0UL,_unsigned_long_*,_false> *)dataptr;
  uStack_108 = uVar26;
  pVStack_100 = this_01;
  uStack_f0 = uVar34;
  pcStack_e8 = (code *)uVar25;
  if (VVar3 == FLAT_VECTOR) {
    Vector::SetVectorType(this,FLAT_VECTOR);
    plVar9 = (long *)this->data;
    ptVar11 = (timestamp_t *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(this);
    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
              (ptVar11,plVar9,count_00,&vector->validity,&this->validity,mask,(bool)adds_nulls_00);
    return;
  }
  if (VVar3 != DICTIONARY_VECTOR) {
    if (VVar3 == CONSTANT_VECTOR) {
      Vector::SetVectorType(this,CONSTANT_VECTOR);
      pdVar7 = this->data;
      piVar8 = (int64_t *)vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(this,true);
        return;
      }
      ConstantVector::SetNull(this,false);
      bVar19 = Value::IsFinite<duckdb::timestamp_t>((timestamp_t)*piVar8);
      if (!bVar19) {
        if ((this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          iStack_118 = (this->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&UStack_168,&iStack_118);
          pdVar14 = UStack_168.data;
          pSVar13 = UStack_168.sel;
          UStack_168.sel = (SelectionVector *)0x0;
          UStack_168.data = (data_ptr_t)0x0;
          p_Var33 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar13;
          (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar14;
          if (p_Var33 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var33);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UStack_168.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)UStack_168.data);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(this->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        puVar10 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        *puVar10 = *puVar10 & 0xfffffffffffffffe;
      }
      pdVar7[0] = '\0';
      pdVar7[1] = '\0';
      pdVar7[2] = '\0';
      pdVar7[3] = '\0';
      pdVar7[4] = '\0';
      pdVar7[5] = '\0';
      pdVar7[6] = '\0';
      pdVar7[7] = '\0';
      return;
    }
    goto LAB_00f7a963;
  }
  if (cVar29 != '\0') goto LAB_00f7a963;
  DictionaryVector::VerifyDictionary(vector);
  pVVar22 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
  UStack_168.sel = (SelectionVector *)pVVar22[1].data.allocator.ptr;
  if (((Allocator *)UStack_168.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar23 = optional_idx::GetIndex((optional_idx *)&UStack_168), count_00 < iVar23 * 2)) {
LAB_00f7abfc:
    bVar19 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(vector);
    pVVar22 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
    bVar19 = *(char *)&pVVar22[1]._vptr_VectorBuffer == '\0';
    if (!bVar19) goto LAB_00f7abfc;
    plVar9 = (long *)this->data;
    ptVar11 = (timestamp_t *)pVVar22[1].data.pointer;
    iVar23 = optional_idx::GetIndex((optional_idx *)&UStack_168);
    FlatVector::VerifyFlatVector((Vector *)(pVVar22 + 1));
    FlatVector::VerifyFlatVector(this);
    ExecuteFlat<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
              (ptVar11,plVar9,iVar23,(ValidityMask *)&pVVar22[1].data.allocated_size,&this->validity
               ,mask,(bool)adds_nulls_00);
    DictionaryVector::VerifyDictionary(vector);
    pVVar22 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
    iVar23 = optional_idx::GetIndex((optional_idx *)&UStack_168);
    Vector::Dictionary(this,this,iVar23,(SelectionVector *)(pVVar22 + 1),count_00);
  }
  if (bVar19) {
    return;
  }
LAB_00f7a963:
  UnifiedVectorFormat::UnifiedVectorFormat(&UStack_168);
  Vector::ToUnifiedFormat(vector,count_00,&UStack_168);
  Vector::SetVectorType(this,FLAT_VECTOR);
  pSVar13 = UStack_168.sel;
  plVar9 = (long *)this->data;
  FlatVector::VerifyFlatVector(this);
  ExecuteLoop<duckdb::timestamp_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::TimezoneMinuteOperator>>
            ((timestamp_t *)UStack_168.data,plVar9,count_00,pSVar13,&UStack_168.validity,
             &this->validity,mask,(bool)adds_nulls_00);
  if (UStack_168.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (UStack_168.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (UStack_168.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (UStack_168.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}